

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O1

CURLcode smtp_setup_connection(connectdata *conn)

{
  Curl_easy *pCVar1;
  CURLcode CVar2;
  void *pvVar3;
  
  conn->tls_upgraded = false;
  pCVar1 = conn->data;
  pvVar3 = (*Curl_ccalloc)(0x28,1);
  (pCVar1->req).protop = pvVar3;
  CVar2 = CURLE_OUT_OF_MEMORY;
  if (pvVar3 != (void *)0x0) {
    CVar2 = CURLE_OK;
  }
  return CVar2;
}

Assistant:

static CURLcode smtp_setup_connection(struct connectdata *conn)
{
  CURLcode result;

  /* Clear the TLS upgraded flag */
  conn->tls_upgraded = FALSE;

  /* Initialise the SMTP layer */
  result = smtp_init(conn);
  if(result)
    return result;

  return CURLE_OK;
}